

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationRootElements::getPrimaryAfter
          (CollationRootElements *this,uint32_t p,int32_t index,UBool isCompressible)

{
  uint32_t uVar1;
  uint uVar2;
  uint *puVar3;
  uint offset;
  
  uVar2 = this->elements[(long)index + 1];
  if ((char)uVar2 < '\0') {
    puVar3 = this->elements + (long)index + 2;
    do {
      uVar2 = *puVar3;
      puVar3 = puVar3 + 1;
    } while ((char)uVar2 < '\0');
  }
  else {
    offset = uVar2 & 0x7f;
    if (offset != 0) {
      if ((short)p != 0) {
        uVar1 = Collation::incThreeBytePrimaryByOffset(p,isCompressible,offset);
        return uVar1;
      }
      uVar1 = Collation::incTwoBytePrimaryByOffset(p,isCompressible,offset);
      return uVar1;
    }
  }
  return uVar2;
}

Assistant:

uint32_t
CollationRootElements::getPrimaryAfter(uint32_t p, int32_t index, UBool isCompressible) const {
    U_ASSERT(p == (elements[index] & 0xffffff00) || isEndOfPrimaryRange(elements[index + 1]));
    uint32_t q = elements[++index];
    int32_t step;
    if((q & SEC_TER_DELTA_FLAG) == 0 && (step = (int32_t)q & PRIMARY_STEP_MASK) != 0) {
        // Return the next primary in this range.
        if((p & 0xffff) == 0) {
            return Collation::incTwoBytePrimaryByOffset(p, isCompressible, step);
        } else {
            return Collation::incThreeBytePrimaryByOffset(p, isCompressible, step);
        }
    } else {
        // Return the next primary in the list.
        while((q & SEC_TER_DELTA_FLAG) != 0) {
            q = elements[++index];
        }
        U_ASSERT((q & PRIMARY_STEP_MASK) == 0);
        return q;
    }
}